

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

String * __thiscall
flatbuffers::Table::GetPointer<flatbuffers::String_const*>(Table *this,voffset_t field)

{
  voffset_t vVar1;
  uint uVar2;
  Table *local_30;
  uint8_t *p;
  voffset_t field_offset;
  voffset_t field_local;
  Table *this_local;
  
  vVar1 = GetOptionalFieldOffset(this,field);
  if (vVar1 == 0) {
    local_30 = (Table *)0x0;
  }
  else {
    uVar2 = ReadScalar<unsigned_int>(this + vVar1);
    local_30 = this + vVar1 + uVar2;
  }
  return (String *)local_30;
}

Assistant:

P GetPointer(voffset_t field) const {
    auto field_offset = GetOptionalFieldOffset(field);
    auto p = &data_[field_offset];
    return field_offset
      ? reinterpret_cast<P>(p + ReadScalar<uoffset_t>(p))
      : nullptr;
  }